

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

optional<pbrt::RGB> __thiscall
pbrt::ParameterDictionary::GetOneRGB(ParameterDictionary *this,string *name)

{
  double dVar1;
  memory_resource *pmVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 (*pauVar4) [16];
  undefined1 auVar5 [16];
  __type _Var6;
  bool bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  long lVar10;
  optional<pbrt::RGB> oVar11;
  
  lVar3 = *(long *)((long)&name[2].field_2 + 8);
  paVar9 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name->_M_string_length !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)name->_M_string_length;
  }
  lVar10 = 0;
  pbVar8 = in_RDX;
  do {
    if (lVar3 << 3 == lVar10) {
      (this->params).alloc.memoryResource = (memory_resource *)0x0;
      (this->params).ptr = (ParsedParameter **)0x0;
LAB_003c707e:
      oVar11._8_8_ = pbVar8;
      oVar11.optionalValue._0_8_ = this;
      return oVar11;
    }
    __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             ((long)paVar9 + lVar10);
    _Var6 = std::operator==(__lhs + 1,in_RDX);
    pbVar8 = extraout_RDX;
    if (_Var6) {
      bVar7 = std::operator==(__lhs,"rgb");
      pbVar8 = extraout_RDX_00;
      if (bVar7) {
        if (__lhs[3].field_2._M_allocated_capacity < 3) {
          ErrorExit<std::__cxx11::string_const&>
                    ((FileLoc *)(__lhs + 2),"Insufficient values for \"rgb\" parameter \"%s\".",
                     __lhs + 1);
        }
        pauVar4 = (undefined1 (*) [16])__lhs[3]._M_dataplus._M_p;
        dVar1 = *(double *)pauVar4[1];
        *(undefined1 *)((long)&(this->params).ptr + 4) = 1;
        auVar5 = vcvtpd2ps_avx(*pauVar4);
        pmVar2 = (memory_resource *)vmovlps_avx(auVar5);
        (this->params).alloc.memoryResource = pmVar2;
        *(float *)&(this->params).ptr = (float)dVar1;
        goto LAB_003c707e;
      }
    }
    lVar10 = lVar10 + 8;
  } while( true );
}

Assistant:

pstd::optional<RGB> ParameterDictionary::GetOneRGB(const std::string &name) const {
    for (const ParsedParameter *p : params) {
        if (p->name == name && p->type == "rgb") {
            if (p->numbers.size() < 3)
                ErrorExit(&p->loc, "Insufficient values for \"rgb\" parameter \"%s\".",
                          p->name);
            return RGB(p->numbers[0], p->numbers[1], p->numbers[2]);
        }
    }
    return {};
}